

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covenant.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pbVar1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  bool bVar4;
  Options opts_;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  char cVar9;
  STATUS SVar10;
  options_description_easy_init *poVar11;
  typed_value<unsigned_int,_char> *ptVar12;
  typed_value<int,_char> *ptVar13;
  typed_value<covenant::AbstractMethod,_char> *ptVar14;
  typed_value<covenant::GeneralizationMethod,_char> *ptVar15;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar16;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar17;
  const_iterator cVar18;
  ostream *poVar19;
  long *plVar20;
  any *paVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  const_iterator cVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  TerminalFactory *this;
  reg_solver_t *s;
  string *psVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  long lVar29;
  uint num_solutions;
  uint incr_witness;
  int freq_incr_witness;
  int shortest_witness;
  AbstractMethod abs;
  GeneralizationMethod gen;
  int max_cegar_iter;
  StrParse input;
  CFGProblem problem;
  string in;
  shared_ptr<covenant::TerminalFactory> tfac;
  string header;
  options_description cmmdline_options;
  variables_map vm;
  options_description log;
  positional_options_description p;
  options_description cegar_params;
  options_description hidden_params;
  options_description config;
  ifstream fd;
  uint local_d68;
  uint local_d64;
  int local_d60;
  int local_d5c;
  AbstractMethod local_d58;
  GeneralizationMethod local_d54;
  int local_d50;
  undefined2 local_d4b;
  undefined1 local_d49;
  undefined1 local_d48 [8];
  _Alloc_hider local_d40;
  undefined1 local_d38 [8];
  char local_d30 [20];
  int local_d1c;
  AbstractMethod local_d18;
  GeneralizationMethod local_d14;
  int local_d10;
  uint local_d0c;
  undefined1 local_d08 [17];
  undefined1 auStack_cf7 [15];
  size_t local_ce8;
  size_t local_ce0;
  float local_cd8;
  size_t local_cd0;
  bucket_pointer ppStack_cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cc0;
  undefined1 *local_ca0;
  long local_c98;
  undefined1 local_c90 [16];
  int local_c80;
  GeneralizationMethod GStack_c7c;
  AbstractMethod AStack_c78;
  undefined1 uStack_c74;
  undefined2 uStack_c73;
  undefined1 uStack_c71;
  int local_c70;
  int iStack_c6c;
  uint uStack_c68;
  uint uStack_c64;
  shared_ptr<covenant::TerminalFactory> local_c60;
  char *local_c50;
  long local_c48;
  char local_c40 [16];
  shared_ptr<covenant::TerminalFactory> local_c30 [11];
  key_type local_b80;
  undefined1 *local_b60;
  long local_b58;
  undefined1 local_b50 [16];
  string local_b40;
  string local_b20;
  undefined1 local_b00 [64];
  void *local_ac0;
  undefined4 local_ab8;
  undefined8 local_ab0;
  undefined4 local_aa8;
  undefined8 local_aa0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_a98 [24];
  undefined **local_a80 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a70 [8];
  _Rb_tree_node_base local_a68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a10;
  GeneralizationMethod local_9e0;
  undefined4 uStack_9dc;
  undefined1 local_9d0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_9b8 [24];
  void *local_9a0;
  undefined4 local_998;
  undefined8 local_990;
  undefined4 local_988;
  undefined8 local_980;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_978 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_960;
  undefined1 *local_948;
  undefined1 local_938 [16];
  AbstractMethod local_928;
  undefined4 uStack_924;
  undefined1 local_918 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_900 [24];
  void *local_8e8;
  undefined4 local_8e0;
  undefined8 local_8d8;
  undefined4 local_8d0;
  undefined8 local_8c8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_8c0 [24];
  int local_8a8;
  undefined4 uStack_8a4;
  undefined1 local_898 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_880 [24];
  void *local_868;
  undefined4 local_860;
  undefined8 local_858;
  undefined4 local_850;
  undefined8 local_848;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_840 [24];
  undefined1 *local_828 [2];
  undefined1 local_818 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_800 [24];
  void *local_7e8;
  undefined4 local_7e0;
  undefined8 local_7d8;
  undefined4 local_7d0;
  undefined8 local_7c8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_7c0 [24];
  CFGProblem local_7a8;
  undefined1 local_748 [24];
  undefined1 local_730 [56];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_6f8 [32];
  pointer local_6d8;
  
  local_d50 = -1;
  local_d54 = GREEDY;
  local_d58 = CYCLE_BREAKING;
  local_d5c = 0;
  local_d60 = -1;
  local_d64 = 1;
  local_d68 = 1;
  local_c50 = local_c40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c50,
             "Covenant: semi-decider for intersection of context-free languages\n","");
  pbVar1 = (pointer)(local_748 + 0x10);
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,
             "Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n","");
  std::__cxx11::string::_M_append((char *)&local_c50,local_748._0_8_);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,"Usage   : covenant [Options] file","");
  std::__cxx11::string::_M_append((char *)&local_c50,local_748._0_8_);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"General options ","");
  boost::program_options::options_description::options_description
            ((options_description *)local_828,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)local_828);
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      ((options_description_easy_init *)local_748,"help,h","print help message");
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"dot",
                       "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements"
                      );
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"verbose,v","verbose mode");
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"stats,s","Show some statistics and exit");
  ptVar12 = boost::program_options::value<unsigned_int>(&local_d68);
  local_a80[0] = (undefined **)CONCAT44(local_a80[0]._4_4_,1);
  ptVar12 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar12,(uint *)local_a80);
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"solutions",(value_semantic *)ptVar12,
                       "enumerate up to n solutions (default n=1)");
  ptVar13 = boost::program_options::value<int>(&local_d50);
  local_8a8 = -1;
  ptVar13 = boost::program_options::typed_value<int,_char>::default_value(ptVar13,&local_8a8);
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"iter,i",(value_semantic *)ptVar13,
                       "maximum number of CEGAR iterations (default no limit)");
  ptVar14 = boost::program_options::value<covenant::AbstractMethod>(&local_d58);
  local_928 = CYCLE_BREAKING;
  ptVar14 = boost::program_options::typed_value<covenant::AbstractMethod,_char>::default_value
                      (ptVar14,&local_928);
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"abs,a",(value_semantic *)ptVar14,
                       "choose abstraction method [sigma-star|cycle-breaking]");
  ptVar15 = boost::program_options::value<covenant::GeneralizationMethod>(&local_d54);
  local_9e0 = GREEDY;
  ptVar15 = boost::program_options::typed_value<covenant::GeneralizationMethod,_char>::default_value
                      (ptVar15,&local_9e0);
  boost::program_options::options_description_easy_init::operator()
            (poVar11,"gen,g",(value_semantic *)ptVar15,
             "choose generalization method [greedy|max-gen]");
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"");
  boost::program_options::options_description::options_description
            ((options_description *)&local_8a8,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)&local_8a8);
  ptVar16 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)local_748,"input-file",(value_semantic *)ptVar16,
             "input file");
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"(unsound) cegar options ","")
  ;
  boost::program_options::options_description::options_description
            ((options_description *)&local_928,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)&local_928);
  ptVar13 = boost::program_options::value<int>(&local_d5c);
  local_a80[0] = (undefined **)((ulong)local_a80[0] & 0xffffffff00000000);
  ptVar13 = boost::program_options::typed_value<int,_char>::default_value(ptVar13,(int *)local_a80);
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      ((options_description_easy_init *)local_748,"l",(value_semantic *)ptVar13,
                       "shortest length of the witness (default 0)");
  ptVar13 = boost::program_options::value<int>(&local_d60);
  local_9e0 = ~GREEDY;
  ptVar13 = boost::program_options::typed_value<int,_char>::default_value(ptVar13,(int *)&local_9e0)
  ;
  poVar11 = (options_description_easy_init *)
            boost::program_options::options_description_easy_init::operator()
                      (poVar11,"freq-incr-witness",(value_semantic *)ptVar13,
                       "how often increasing witnesses\' length");
  ptVar12 = boost::program_options::value<unsigned_int>(&local_d64);
  local_b00._0_4_ = 1;
  ptVar12 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar12,(uint *)local_b00);
  boost::program_options::options_description_easy_init::operator()
            (poVar11,"delta-incr-witness",(value_semantic *)ptVar12,
             "how much witnesses\' length is incremented");
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"Logging Options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_9e0,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)&local_9e0);
  ptVar17 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x0);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)local_748,"log",(value_semantic *)ptVar17,
             "Enable specified log level");
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_960);
  boost::program_options::positional_options_description::add
            ((positional_options_description *)&local_960,"input-file",-1);
  boost::program_options::options_description::options_description
            ((options_description *)local_b00,0x50,0x28);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)local_828);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)&local_8a8);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)&local_928);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)&local_9e0);
  boost::program_options::variables_map::variables_map((variables_map *)local_a80);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_748,argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((cmdline *)local_748,(options_description *)local_b00);
  local_6d8 = (pointer)local_b00;
  boost::program_options::detail::cmdline::set_positional_options
            ((cmdline *)local_748,(positional_options_description *)&local_960);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_d08,(basic_command_line_parser<char> *)local_748);
  boost::program_options::store((basic_parsed_options *)local_d08,(variables_map *)local_a80,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_d08);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_6f8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_730 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_748);
  boost::program_options::notify((variables_map *)local_a80);
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"help","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_a70,(key_type *)local_748);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  if (cVar18._M_node != &local_a68) {
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_c50,local_c48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    poVar19 = (ostream *)std::ostream::flush();
    plVar20 = (long *)boost::program_options::operator<<(poVar19,(options_description *)local_828);
    std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
    std::ostream::put((char)plVar20);
    std::ostream::flush();
    goto LAB_0012e4c9;
  }
  local_ca0 = local_c90;
  local_c98 = 0;
  local_c90[0] = 0;
  local_748._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"input-file","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_a70,(key_type *)local_748);
  if ((pointer)local_748._0_8_ != pbVar1) {
    operator_delete((void *)local_748._0_8_);
  }
  if (cVar18._M_node == &local_a68) {
LAB_0012e471:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Input file not found ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  else {
    local_748._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"input-file","");
    paVar21 = (any *)boost::program_options::abstract_variables_map::operator[]
                               ((abstract_variables_map *)local_a80,(string *)local_748);
    pbVar22 = boost::any_cast<std::__cxx11::string_const&>(paVar21);
    pcVar3 = (pbVar22->_M_dataplus)._M_p;
    local_d08._0_8_ = (pointer)(local_d08 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d08,pcVar3,pcVar3 + pbVar22->_M_string_length);
    if ((pointer)local_748._0_8_ != pbVar1) {
      operator_delete((void *)local_748._0_8_);
    }
    std::ifstream::ifstream(local_748);
    std::ifstream::open((char *)local_748,(_Ios_Openmode)local_d08._0_8_);
    if (*(int *)(local_730 + *(size_type *)(local_748._0_8_ + -0x18) + 8) != 0) {
      std::ifstream::~ifstream(local_748);
      if ((pointer)local_d08._0_8_ != (pointer)(local_d08 + 0x10)) {
        operator_delete((void *)local_d08._0_8_);
      }
      goto LAB_0012e471;
    }
    if ((local_730[*(size_type *)(local_748._0_8_ + -0x18) + 8] & 2) == 0) {
      do {
        local_d40._M_p = (char *)0x0;
        local_d38[0] = 0;
        local_d48 = (undefined1  [8])local_d38;
        cVar9 = std::ios::widen((char)*(size_type *)(local_748._0_8_ + -0x18) +
                                (char)(istream *)local_748);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_748,(string *)local_d48,cVar9);
        std::__cxx11::string::_M_append((char *)&local_ca0,(ulong)local_d48);
        std::__cxx11::string::append((char *)&local_ca0);
        if (local_d48 != (undefined1  [8])local_d38) {
          operator_delete((void *)local_d48);
        }
      } while ((local_730[*(size_type *)(local_748._0_8_ + -0x18) + 8] & 2) == 0);
    }
    std::ifstream::close();
    p_Var2 = &local_a68;
    std::ifstream::~ifstream(local_748);
    if ((pointer)local_d08._0_8_ != (pointer)(local_d08 + 0x10)) {
      operator_delete((void *)local_d08._0_8_);
    }
    local_748._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"dot","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_a70,(key_type *)local_748);
    if ((pointer)local_748._0_8_ != pbVar1) {
      operator_delete((void *)local_748._0_8_);
    }
    local_748._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"verbose","");
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_a70,(key_type *)local_748);
    if ((pointer)local_748._0_8_ != pbVar1) {
      operator_delete((void *)local_748._0_8_);
    }
    if (cVar23._M_node != p_Var2) {
      local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"verbose","");
      avy::AvyEnableLog(&local_b20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
        operator_delete(local_b20._M_dataplus._M_p);
      }
    }
    local_748._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"log","");
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_a70,(key_type *)local_748);
    if ((pointer)local_748._0_8_ != pbVar1) {
      operator_delete((void *)local_748._0_8_);
    }
    if (cVar23._M_node != p_Var2) {
      local_748._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"log","");
      paVar21 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((abstract_variables_map *)local_a80,(string *)local_748);
      __x = boost::
            any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                      (paVar21);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d08,__x);
      if ((pointer)local_748._0_8_ != pbVar1) {
        operator_delete((void *)local_748._0_8_);
      }
      if ((pointer)CONCAT71(local_d08._9_7_,local_d08[8]) != (pointer)local_d08._0_8_) {
        uVar25 = 0;
        uVar26 = 1;
        do {
          lVar28 = *(long *)((long)&(((CFG *)(local_d08._0_8_ + 0x18))->TrackedTerms).table_.
                                    super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                            + uVar25 * 0x20 + -0x18);
          local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b40,lVar28,
                     *(long *)((long)&(((CFG *)(local_d08._0_8_ + 0x18))->TrackedTerms).table_.
                                      super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                              + uVar25 * 0x20 + -0x10) + lVar28);
          avy::AvyEnableLog(&local_b40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
            operator_delete(local_b40._M_dataplus._M_p);
          }
          bVar4 = uVar26 < (ulong)(CONCAT71(local_d08._9_7_,local_d08[8]) - local_d08._0_8_ >> 5);
          uVar25 = uVar26;
          uVar26 = (ulong)((int)uVar26 + 1);
        } while (bVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d08);
    }
    iVar7 = local_d5c;
    iVar6 = local_d60;
    uVar5 = local_d64;
    local_d10 = local_d50;
    local_d14 = local_d54;
    local_d18 = local_d58;
    local_d0c = local_d68;
    local_d08[0x10] = 0;
    auStack_cf7._0_8_ = 0;
    local_d08._0_8_ = (pointer)0x0;
    local_d08[8] = 0;
    local_d08._9_7_ = 0;
    local_ce8 = 0x10;
    local_ce0 = 0;
    local_cd8 = 1.0;
    local_cd0 = 0;
    ppStack_cc8 = (bucket_pointer)0x0;
    local_cc0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cc0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cc0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d48 = (undefined1  [8])((ulong)local_d48 & 0xffffffff00000000);
    local_d40._M_p = local_d30;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d40,local_ca0,local_ca0 + local_c98);
    this = (TerminalFactory *)operator_new(0x18);
    covenant::TerminalFactory::TerminalFactory(this);
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr<covenant::TerminalFactory>
              (&local_c60,this);
    local_c30[0].px = local_c60.px;
    local_c30[0].pn.pi_ = local_c60.pn.pi_;
    if (local_c60.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_c60.pn.pi_)->use_count_ = (local_c60.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
              ((CFGProblem *)local_d08,(StrParse *)local_d48,local_c30);
    boost::detail::shared_count::~shared_count(&local_c30[0].pn);
    if ((int)((ulong)(CONCAT71(local_d08._9_7_,local_d08[8]) - local_d08._0_8_) >> 3) * 0x286bca1b
        == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"covenant: no CFGs found.",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
    }
    else {
      local_d1c = iVar6;
      if (0 < (int)((ulong)(CONCAT71(local_d08._9_7_,local_d08[8]) - local_d08._0_8_) >> 3) *
              0x286bca1b) {
        lVar29 = 0;
        lVar28 = 0;
        do {
          uVar8 = local_d08._0_8_;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_748,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(((string *)
                              (&(((CFG *)(local_d08._0_8_ + 0x18))->TrackedTerms).table_.
                                super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                              + -8))->_M_dataplus)._M_p + lVar29));
          covenant::CFG::CFG((CFG *)local_730,
                             (CFG *)((((CFG *)(uVar8 + 0x18))->TrackedTerms).table_.
                                     super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                     .funcs_ + lVar29 + -1));
          if (local_748._0_8_ == local_748._8_8_) {
            psVar24 = (string *)__cxa_allocate_exception(0x20);
            local_b60 = local_b50;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b60,"expected at least one CFG","");
            *(string **)psVar24 = psVar24 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar24,local_b60,local_b60 + local_b58);
            __cxa_throw(psVar24,&covenant::error::typeinfo,covenant::error::~error);
          }
          covenant::CFG::check_well_formed((CFG *)local_730);
          covenant::CFG::~CFG((CFG *)local_730);
          if ((pointer)local_748._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_748._0_8_);
          }
          lVar28 = lVar28 + 1;
          lVar29 = lVar29 + 0x98;
        } while (lVar28 < (int)((ulong)(CONCAT71(local_d08._9_7_,local_d08[8]) - local_d08._0_8_) >>
                               3) * 0x286bca1b);
      }
      s = (reg_solver_t *)operator_new(8);
      s->_vptr_RegSolver = (_func_int **)&PTR__RegSolver_001aaef0;
      std::
      vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>::
      vector(&local_7a8.cns,
             (vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
              *)local_d08);
      iVar6 = local_d1c;
      boost::unordered::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::unordered_map(&local_7a8.var_table,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)(auStack_cf7 + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7a8.names,&local_cc0);
      local_c80 = local_d10;
      GStack_c7c = local_d14;
      AStack_c78 = local_d18;
      uStack_c73 = local_d4b;
      uStack_c71 = local_d49;
      local_c70 = iVar7;
      iStack_c6c = iVar6;
      uStack_c68 = uVar5;
      uStack_c64 = local_d0c;
      opts_.gen = local_d14;
      opts_.max_cegar_iter = local_d10;
      opts_.is_dot_enabled = cVar18._M_node != p_Var2;
      opts_.abs = local_d18;
      opts_._13_2_ = local_d4b;
      opts_._15_1_ = local_d49;
      opts_.freq_incr_witness = iVar6;
      opts_.shortest_witness = iVar7;
      opts_.num_solutions = local_d0c;
      opts_.incr_witness = uVar5;
      uStack_c74 = cVar18._M_node != p_Var2;
      covenant::Solver<covenant::Sym>::Solver((Solver<covenant::Sym> *)local_748,&local_7a8,s,opts_)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_7a8.names);
      boost::unordered::detail::
      table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~table(&local_7a8.var_table.table_);
      std::
      vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>::
      ~vector(&local_7a8.cns);
      covenant::Solver<covenant::Sym>::preprocess((Solver<covenant::Sym> *)local_748);
      local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"stats","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a70,&local_b80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
        operator_delete(local_b80._M_dataplus._M_p);
      }
      if (cVar18._M_node == &local_a68) {
        SVar10 = covenant::Solver<covenant::Sym>::solve((Solver<covenant::Sym> *)local_748);
        if (SVar10 == SAT) {
          lVar28 = 0x12;
          pcVar27 = "======\nSAT\n======\n";
        }
        else if (SVar10 == UNSAT) {
          lVar28 = 0x14;
          pcVar27 = "======\nUNSAT\n======\n";
        }
        else {
          lVar28 = 0x16;
          pcVar27 = "======\nUNKNOWN\n======\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar27,lVar28);
      }
      else {
        covenant::Solver<covenant::Sym>::stats
                  ((Solver<covenant::Sym> *)local_748,(ostream *)&std::cout);
        (*s->_vptr_RegSolver[1])(s);
      }
      covenant::Solver<covenant::Sym>::~Solver((Solver<covenant::Sym> *)local_748);
      if (cVar18._M_node == &local_a68) {
        (*s->_vptr_RegSolver[1])(s);
      }
    }
    boost::detail::shared_count::~shared_count(&local_c60.pn);
    if (local_d40._M_p != local_d30) {
      operator_delete(local_d40._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_cc0);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~table((table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(auStack_cf7 + 7));
    std::vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
    ::~vector((vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
               *)local_d08);
  }
  if (local_ca0 != local_c90) {
    operator_delete(local_ca0);
  }
LAB_0012e4c9:
  local_a80[0] = &PTR__variables_map_001a9838;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a10);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_a40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_a70);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_a98);
  if (local_ac0 != (void *)0x0) {
    operator_delete(local_ac0);
    local_ac0 = (void *)0x0;
    local_ab8 = 0;
    local_ab0 = 0;
    local_aa8 = 0;
    local_aa0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)(local_b00 + 0x28));
  if ((undefined1 *)CONCAT44(local_b00._4_4_,local_b00._0_4_) != local_b00 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_b00._4_4_,local_b00._0_4_));
  }
  if (local_948 != local_938) {
    operator_delete(local_948);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_960);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_978);
  if (local_9a0 != (void *)0x0) {
    operator_delete(local_9a0);
    local_9a0 = (void *)0x0;
    local_998 = 0;
    local_990 = 0;
    local_988 = 0;
    local_980 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_9b8);
  if ((undefined1 *)CONCAT44(uStack_9dc,local_9e0) != local_9d0) {
    operator_delete((undefined1 *)CONCAT44(uStack_9dc,local_9e0));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_8c0);
  if (local_8e8 != (void *)0x0) {
    operator_delete(local_8e8);
    local_8e8 = (void *)0x0;
    local_8e0 = 0;
    local_8d8 = 0;
    local_8d0 = 0;
    local_8c8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_900);
  if ((undefined1 *)CONCAT44(uStack_924,local_928) != local_918) {
    operator_delete((undefined1 *)CONCAT44(uStack_924,local_928));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_840);
  if (local_868 != (void *)0x0) {
    operator_delete(local_868);
    local_868 = (void *)0x0;
    local_860 = 0;
    local_858 = 0;
    local_850 = 0;
    local_848 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_880);
  if ((undefined1 *)CONCAT44(uStack_8a4,local_8a8) != local_898) {
    operator_delete((undefined1 *)CONCAT44(uStack_8a4,local_8a8));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_7c0);
  if (local_7e8 != (void *)0x0) {
    operator_delete(local_7e8);
    local_7e8 = (void *)0x0;
    local_7e0 = 0;
    local_7d8 = 0;
    local_7d0 = 0;
    local_7c8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_800);
  if (local_828[0] != local_818) {
    operator_delete(local_828[0]);
  }
  if (local_c50 != local_c40) {
    operator_delete(local_c50);
  }
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
  typedef Sym edge_sym_t;
  typedef Solver<edge_sym_t> solver_t;
  typedef RegSolver<edge_sym_t> reg_solver_t;

  // Main flags
  int max_cegar_iter=-1;
  GeneralizationMethod gen = GREEDY;
  AbstractMethod abs = CYCLE_BREAKING;
  // Heuristics flags
  // - regular solver will try to find a witness starting from this length
  int shortest_witness = 0;
  // - increase the witness length after n iterations -1 disable this option.
  int freq_incr_witness = -1;
  // - increment the witness length by n but only if freq_incr_witness >= 0
  unsigned incr_witness = 1;
  // Other flags
  bool is_dot_enabled=false;
  unsigned num_solutions = 1;

  string header("Covenant: semi-decider for intersection of context-free languages\n");
  header += string ("Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n");
  header += string ("Usage   : covenant [Options] file");

  po::options_description config("General options ");
  config.add_options()
      ("help,h", "print help message")
      ("dot" , 
       "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements")
      ("verbose,v" , "verbose mode")
      ("stats,s", "Show some statistics and exit")
      ("solutions" , po::value<unsigned>(&num_solutions)->default_value(1), 
       "enumerate up to n solutions (default n=1)")
      ("iter,i",  po::value<int>(&max_cegar_iter)->default_value(-1), 
       "maximum number of CEGAR iterations (default no limit)")
      ("abs,a",  po::value<AbstractMethod>(&abs)->default_value(CYCLE_BREAKING), 
       "choose abstraction method [sigma-star|cycle-breaking]")
      ("gen,g",  po::value<GeneralizationMethod>(&gen)->default_value(GREEDY), 
       "choose generalization method [greedy|max-gen]")
      ;

  po::options_description hidden_params("");
  hidden_params.add_options()
      ("input-file",  po::value<string>(), "input file")
      ;
      
  po::options_description cegar_params("(unsound) cegar options ");
  cegar_params.add_options()
      ("l",  po::value<int>(&shortest_witness)->default_value(0), 
       "shortest length of the witness (default 0)")
      ("freq-incr-witness",  po::value<int>(&freq_incr_witness)->default_value(-1), 
       "how often increasing witnesses' length")
      ("delta-incr-witness",  po::value<unsigned>(&incr_witness)->default_value(1), 
       "how much witnesses' length is incremented")
      ;

  po::options_description log("Logging Options");
  log.add_options()
      ("log",  po::value<std::vector<string> >(), "Enable specified log level")
      ;

  po::positional_options_description p;
  p.add("input-file", -1);

  po::options_description cmmdline_options;
  cmmdline_options.add(config);
  cmmdline_options.add(hidden_params);
  cmmdline_options.add(cegar_params);
  cmmdline_options.add(log);
  
  po::variables_map vm;

  try {
    po::store(po::command_line_parser(argc, argv).
              options(cmmdline_options).
              positional(p).
              run(), vm);
    po::notify(vm);    
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (vm.count("help"))
  {
    cout << header << endl << config << endl; 
    return 0;
  }  

  std::string in;
  bool file_opened = false;
  if (vm.count ("input-file"))
  {
    std::string infile = vm ["input-file"].as<std::string> ();
    std::ifstream fd;
    fd.open (infile.c_str ());
    if (fd.good ())
    {
      file_opened = true;
      while (!fd.eof ())
      {
        std::string line;
        getline(fd, line);
        in += line;
        in += "\n";
      }
      fd.close ();
    }
  }

  if (!file_opened)
  {
    cout << "Input file not found " << endl;
    return 0;
  }

  if (vm.count("dot"))
  {
    is_dot_enabled = true;
  }

  if (vm.count("verbose"))
  {
    avy::AvyEnableLog ("verbose");
  }

  // enable loggers
  if (vm.count("log"))
  {
    vector<string> loggers = vm ["log"].as<vector<string> > ();
    for(unsigned int i=0; i<loggers.size (); i++)
    {
      avy::AvyEnableLog (loggers [i]);
    }
  }

  solver_t::Options opts(max_cegar_iter, 
                         gen, 
                         abs, 
                         is_dot_enabled, 
                         shortest_witness, 
                         freq_incr_witness, 
                         incr_witness,
                         num_solutions);

  CFGProblem problem;
  StrParse input(in); 
  boost::shared_ptr<TerminalFactory> tfac (new TerminalFactory ());
  try
  {
    parse_problem(problem, input, tfac);
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (problem.size() == 0)
  {
    cerr << "covenant: no CFGs found." << endl;  
    return 0;
  }

  try
  {
    for(int ii = 0; ii < problem.size(); ii++)
    {
      CFGProblem::Constraint cn(problem[ii]);
      if (cn.vars.empty())
      {
        throw error("expected at least one CFG");
      }
      cn.lang.check_well_formed();
    }
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }
    
  reg_solver_t *regsolver = new Product<edge_sym_t>();
  try
  {
    solver_t s(problem, regsolver, opts);

    s.preprocess ();

    if (vm.count("stats"))
    {
      s.stats (cout);
      delete regsolver;
      return 0;
    }

    STATUS res = s.solve();

    switch (res)
    {
      case SAT:
        cout << "======\nSAT\n======\n";
        break;
      case UNSAT:
        cout << "======\nUNSAT\n======\n";
        break;
      default:
        cout << "======\nUNKNOWN\n======\n";  
        break;
    }
      
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
  }
  catch(Exit &e)
  {
    cerr << e << endl;
  }

  delete regsolver;

  return 0;
}